

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_eckey_negate_test(void)

{
  int iVar1;
  uchar seckey_tmp [32];
  uchar seckey [32];
  uchar *in_stack_ffffffffffffffd0;
  uchar *local_28;
  secp256k1_context *in_stack_ffffffffffffffe0;
  secp256k1_context *seckey_00;
  secp256k1_context *in_stack_ffffffffffffffe8;
  uchar *local_10;
  
  random_scalar_order_b32(in_stack_ffffffffffffffd0);
  seckey_00 = in_stack_ffffffffffffffe0;
  iVar1 = secp256k1_ec_seckey_negate(in_stack_ffffffffffffffe8,(uchar *)in_stack_ffffffffffffffe0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x198f,"test condition failed: secp256k1_ec_seckey_negate(CTX, seckey) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&local_28,&stack0xffffffffffffffb8,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1990,"test condition failed: secp256k1_memcmp_var(seckey, seckey_tmp, 32) != 0");
    abort();
  }
  iVar1 = secp256k1_ec_seckey_negate(in_stack_ffffffffffffffe8,(uchar *)seckey_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1991,"test condition failed: secp256k1_ec_seckey_negate(CTX, seckey) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&local_28,&stack0xffffffffffffffb8,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1992,"test condition failed: secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0");
    abort();
  }
  iVar1 = secp256k1_ec_seckey_negate(in_stack_ffffffffffffffe8,(uchar *)seckey_00);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1995,"test condition failed: secp256k1_ec_seckey_negate(CTX, seckey) == 1");
    abort();
  }
  iVar1 = secp256k1_ec_privkey_negate(in_stack_ffffffffffffffe0,local_28);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1996,"test condition failed: secp256k1_ec_privkey_negate(CTX, seckey_tmp) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&local_28,&stack0xffffffffffffffb8,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1997,"test condition failed: secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0");
    abort();
  }
  memset(&local_28,0,0x20);
  memset(&stack0xffffffffffffffb8,0,0x20);
  iVar1 = secp256k1_ec_seckey_negate(in_stack_ffffffffffffffe8,(uchar *)seckey_00);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x199c,"test condition failed: secp256k1_ec_seckey_negate(CTX, seckey) == 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&local_28,&stack0xffffffffffffffb8,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x199e,"test condition failed: secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0");
    abort();
  }
  random_scalar_order_b32(local_10);
  memset(&local_28,0xff,0x10);
  memset(&stack0xffffffffffffffb8,0,0x20);
  iVar1 = secp256k1_ec_seckey_negate(in_stack_ffffffffffffffe8,(uchar *)seckey_00);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x19a6,"test condition failed: secp256k1_ec_seckey_negate(CTX, seckey) == 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&local_28,&stack0xffffffffffffffb8,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x19a7,"test condition failed: secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0");
    abort();
  }
  return;
}

Assistant:

static void run_eckey_negate_test(void) {
    unsigned char seckey[32];
    unsigned char seckey_tmp[32];

    random_scalar_order_b32(seckey);
    memcpy(seckey_tmp, seckey, 32);

    /* Verify negation changes the key and changes it back */
    CHECK(secp256k1_ec_seckey_negate(CTX, seckey) == 1);
    CHECK(secp256k1_memcmp_var(seckey, seckey_tmp, 32) != 0);
    CHECK(secp256k1_ec_seckey_negate(CTX, seckey) == 1);
    CHECK(secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0);

    /* Check that privkey alias gives same result */
    CHECK(secp256k1_ec_seckey_negate(CTX, seckey) == 1);
    CHECK(secp256k1_ec_privkey_negate(CTX, seckey_tmp) == 1);
    CHECK(secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0);

    /* Negating all 0s fails */
    memset(seckey, 0, 32);
    memset(seckey_tmp, 0, 32);
    CHECK(secp256k1_ec_seckey_negate(CTX, seckey) == 0);
    /* Check that seckey is not modified */
    CHECK(secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0);

    /* Negating an overflowing seckey fails and the seckey is zeroed. In this
     * test, the seckey has 16 random bytes to ensure that ec_seckey_negate
     * doesn't just set seckey to a constant value in case of failure. */
    random_scalar_order_b32(seckey);
    memset(seckey, 0xFF, 16);
    memset(seckey_tmp, 0, 32);
    CHECK(secp256k1_ec_seckey_negate(CTX, seckey) == 0);
    CHECK(secp256k1_memcmp_var(seckey, seckey_tmp, 32) == 0);
}